

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

void Curl_cpool_destroy(cpool *cpool)

{
  Curl_easy *pCVar1;
  curl_trc_feat *pcVar2;
  ulong uVar3;
  connectdata *conn;
  char *pcVar4;
  sigpipe_ignore pipe_st;
  _union_1457 local_c8 [19];
  
  if (cpool != (cpool *)0x0) {
    if (((cpool->field_0x68 & 2) != 0) && (pCVar1 = cpool->idata, pCVar1 != (Curl_easy *)0x0)) {
      if ((((pCVar1->set).field_0x89f & 0x40) != 0) &&
         (((pcVar2 = (pCVar1->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)
           ) && (0 < Curl_trc_feat_multi.log_level)))) {
        pcVar4 = "[SHARE] ";
        if (cpool->share == (Curl_share *)0x0) {
          pcVar4 = "";
        }
        Curl_trc_multi(pCVar1,"%s[CPOOL] destroy, %zu connections",pcVar4,cpool->num_conn);
      }
      memset(&pipe_st,0,0xa0);
      pipe_st._152_1_ = 1;
      if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
        Curl_share_lock(cpool->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
      }
      cpool->field_0x68 = cpool->field_0x68 | 1;
      conn = cpool_get_first(cpool);
      while (conn != (connectdata *)0x0) {
        cpool_remove_conn(cpool,conn);
        pCVar1 = cpool->idata;
        if (((uint)((ulong)*(undefined8 *)&(pCVar1->set).field_0x89c >> 0x21) & 1) !=
            ((byte)pipe_st._152_1_ & 1)) {
          sigpipe_restore(&pipe_st);
          uVar3 = *(ulong *)&(pCVar1->set).field_0x89c;
          pipe_st._152_1_ = pipe_st._152_1_ & 0xfe | (byte)(uVar3 >> 0x21) & 1;
          if ((uVar3 >> 0x21 & 1) == 0) {
            sigaction(0xd,(sigaction *)0x0,(sigaction *)&pipe_st);
            memcpy(local_c8,&pipe_st,0x98);
            local_c8[0] = (_union_1457)0x1;
            sigaction(0xd,(sigaction *)local_c8,(sigaction *)0x0);
          }
        }
        Curl_conncontrol(conn,1);
        cpool_discard_conn(cpool,cpool->idata,conn,false);
        conn = cpool_get_first(cpool);
      }
      cpool->field_0x68 = cpool->field_0x68 & 0xfe;
      if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
        Curl_share_unlock(cpool->idata,CURL_LOCK_DATA_CONNECT);
      }
      sigpipe_restore(&pipe_st);
      Curl_hash_destroy(&cpool->dest2bundle);
    }
  }
  return;
}

Assistant:

void Curl_cpool_destroy(struct cpool *cpool)
{
  if(cpool && cpool->initialised && cpool->idata) {
    struct connectdata *conn;
    SIGPIPE_VARIABLE(pipe_st);

    CURL_TRC_M(cpool->idata, "%s[CPOOL] destroy, %zu connections",
               cpool->share ? "[SHARE] " : "", cpool->num_conn);
    /* Move all connections to the shutdown list */
    sigpipe_init(&pipe_st);
    CPOOL_LOCK(cpool, cpool->idata);
    conn = cpool_get_first(cpool);
    while(conn) {
      cpool_remove_conn(cpool, conn);
      sigpipe_apply(cpool->idata, &pipe_st);
      connclose(conn, "kill all");
      cpool_discard_conn(cpool, cpool->idata, conn, FALSE);
      conn = cpool_get_first(cpool);
    }
    CPOOL_UNLOCK(cpool, cpool->idata);
    sigpipe_restore(&pipe_st);
    Curl_hash_destroy(&cpool->dest2bundle);
  }
}